

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  cmGeneratorTarget *this_01;
  pointer ppcVar1;
  bool bVar2;
  TargetType TVar3;
  string *config;
  mapped_type *this_02;
  pointer ppcVar4;
  pointer ppcVar5;
  bool hasSourceExtension;
  cmGeneratorTarget *gt;
  string dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string objectName;
  bool local_d9;
  cmGeneratorTarget *local_d8;
  cmLocalUnixMakefileGenerator3 *local_d0;
  string local_c8;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_a8;
  pointer local_88;
  pointer local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_78;
  string local_70;
  string local_50;
  
  local_80 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_d0 = this;
  local_78 = localObjectFiles;
  for (ppcVar5 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != local_80;
      ppcVar5 = ppcVar5 + 1) {
    local_d8 = *ppcVar5;
    TVar3 = cmGeneratorTarget::GetType(local_d8);
    this_01 = local_d8;
    if (TVar3 != INTERFACE_LIBRARY) {
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = (local_d0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_70);
      config = cmMakefile::GetSafeDefinition(this_00,&local_c8);
      cmGeneratorTarget::GetObjectSources
                (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                         &local_a8,config);
      std::__cxx11::string::~string((string *)&local_c8);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_d8->LocalGenerator);
      std::__cxx11::string::append((string *)&local_c8);
      std::__cxx11::string::append((char *)&local_c8);
      (*(local_d0->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
                (&local_70,local_d0,local_d8);
      std::__cxx11::string::append((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)&local_c8);
      ppcVar1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
      local_88 = ppcVar5;
      for (ppcVar4 = local_a8._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
          ppcVar4 = ppcVar4 + 1) {
        source = *ppcVar4;
        local_d9 = true;
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  (&local_70,(cmLocalGenerator *)local_d0,source,&local_c8,&local_d9,(char *)0x0);
        bVar2 = cmsys::SystemTools::FileIsFullPath(&local_70);
        if (bVar2) {
          cmsys::SystemTools::GetFilenameName(&local_50,&local_70);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](local_78,&local_70);
        this_02->HasSourceExtension = local_d9;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_50,source);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
        ::emplace_back<cmGeneratorTarget*&,std::__cxx11::string>
                  ((vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
                    *)this_02,&local_d8,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&local_c8);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&local_a8);
      ppcVar5 = local_88;
    }
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetLocalObjectFiles(
  std::map<std::string, LocalObjectInfo>& localObjectFiles)
{
  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* gt : targets) {
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(
      objectSources, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(gt);
    dir += "/";
    // Compute the name of each object file.
    for (cmSourceFile const* sf : objectSources) {
      bool hasSourceExtension = true;
      std::string objectName =
        this->GetObjectFileNameWithoutTarget(*sf, dir, &hasSourceExtension);
      if (cmSystemTools::FileIsFullPath(objectName)) {
        objectName = cmSystemTools::GetFilenameName(objectName);
      }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.emplace_back(gt, sf->GetLanguage());
    }
  }
}